

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder.cpp
# Opt level: O0

bool __thiscall duckdb::Binder::HasActiveBinder(Binder *this)

{
  bool bVar1;
  Binder *in_stack_00000010;
  
  GetActiveBinders(in_stack_00000010);
  bVar1 = ::std::
          vector<std::reference_wrapper<duckdb::ExpressionBinder>,_std::allocator<std::reference_wrapper<duckdb::ExpressionBinder>_>_>
          ::empty((vector<std::reference_wrapper<duckdb::ExpressionBinder>,_std::allocator<std::reference_wrapper<duckdb::ExpressionBinder>_>_>
                   *)in_stack_00000010);
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

bool Binder::HasActiveBinder() {
	return !GetActiveBinders().empty();
}